

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_extension(lyout *out,int level,lys_ext *ext)

{
  int iVar1;
  char *text;
  int local_2c;
  int local_28;
  int i;
  int close2;
  int close;
  lys_ext *ext_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  i = 0;
  local_28 = 0;
  _close2 = (lys_node *)ext;
  ext_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,"extension","name",ext->name,0);
  ext_local._4_4_ = ext_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,ext_local._4_4_,_close2,_close2->module,&i,1);
  if (_close2->iffeature == (lys_iffeature *)0x0) goto LAB_001b3f0a;
  yin_print_close_parent(plStack_10,&i);
  yin_print_open(plStack_10,ext_local._4_4_,(char *)0x0,"argument","name",(char *)_close2->iffeature
                 ,local_28);
  local_2c = -1;
  while( true ) {
    local_2c = lys_ext_iter(_close2->ext,_close2->ext_size,(char)local_2c + '\x01',
                            LYEXT_SUBSTMT_ARGUMENT);
    if (local_2c == -1) break;
    yin_print_close_parent(plStack_10,&local_28);
    yin_print_extension_instances
              (plStack_10,ext_local._4_4_ + 1,_close2->module,LYEXT_SUBSTMT_ARGUMENT,'\0',
               _close2->ext + local_2c,1);
  }
  if ((_close2->flags & 1) == 0) {
    iVar1 = lys_ext_iter(_close2->ext,_close2->ext_size,'\0',LYEXT_SUBSTMT_YINELEM);
    if (iVar1 != -1) goto LAB_001b3e8c;
  }
  else {
LAB_001b3e8c:
    yin_print_close_parent(plStack_10,&local_28);
    text = "false";
    if ((_close2->flags & 1) != 0) {
      text = "true";
    }
    yin_print_substmt(plStack_10,ext_local._4_4_ + 1,LYEXT_SUBSTMT_YINELEM,'\0',text,_close2->module
                      ,_close2->ext,(uint)_close2->ext_size);
  }
  yin_print_close(plStack_10,ext_local._4_4_,(char *)0x0,"argument",local_28);
LAB_001b3f0a:
  yin_print_snode_common(plStack_10,ext_local._4_4_,_close2,_close2->module,&i,0x70);
  ext_local._4_4_ = ext_local._4_4_ + -1;
  yin_print_close(plStack_10,ext_local._4_4_,(char *)0x0,"extension",i);
  return;
}

Assistant:

static void
yin_print_extension(struct lyout *out, int level, const struct lys_ext *ext)
{
    int close = 0, close2 = 0, i;

    yin_print_open(out, level, NULL, "extension", "name", ext->name, close);
    level++;

    yin_print_snode_common(out, level, (struct lys_node *)ext, ext->module, &close,
                           SNODE_COMMON_EXT);

    if (ext->argument) {
        yin_print_close_parent(out, &close);
        yin_print_open(out, level, NULL, "argument", "name", ext->argument, close2);
        i = -1;
        while ((i = lys_ext_iter(ext->ext, ext->ext_size, i + 1, LYEXT_SUBSTMT_ARGUMENT)) != -1) {
            yin_print_close_parent(out, &close2);
            yin_print_extension_instances(out, level + 1, ext->module, LYEXT_SUBSTMT_ARGUMENT, 0, &ext->ext[i], 1);
        }
        if ((ext->flags & LYS_YINELEM) || lys_ext_iter(ext->ext, ext->ext_size, 0, LYEXT_SUBSTMT_YINELEM) != -1) {
            yin_print_close_parent(out, &close2);
            yin_print_substmt(out, level + 1, LYEXT_SUBSTMT_YINELEM, 0,
                              (ext->flags & LYS_YINELEM) ? "true" : "false", ext->module, ext->ext, ext->ext_size);
        }
        yin_print_close(out, level, NULL, "argument", close2);
    }

    yin_print_snode_common(out, level, (struct lys_node *)ext, ext->module, &close,
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    yin_print_close(out, level, NULL, "extension", close);
}